

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_NetworkSelectNonexisting_Test::TestBody
          (InterpreterTestSuite_PC_NetworkSelectNonexisting_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  Registry *pRVar6;
  Status SVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  Status local_4ea;
  Status local_4e9;
  string local_4e8;
  string local_4c8;
  undefined1 local_4a0 [8];
  _Alloc_hider local_498;
  char local_490 [8];
  char local_488 [16];
  _Alloc_hider local_478;
  char local_468 [16];
  internal local_458 [8];
  undefined8 *local_450;
  string local_448;
  Value value;
  string local_3e0;
  State local_3c0;
  State local_3bc;
  Network nwk;
  ByteArray local_358;
  ByteArray local_338;
  char *local_320;
  string local_318;
  UnixTime local_2f8;
  UnixTime local_2f0;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  nwk.mId.mId = 0;
  nwk.mDomainId.mId = 0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&nwk);
  if ((char)br._vptr_BorderRouter == '\0') {
    testing::Message::Message((Message *)&nwk);
    if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x5e0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
    local_450 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (local_450 == (undefined8 *)0x0) goto LAB_00175efc;
    if ((undefined8 *)*local_450 != local_450 + 2) {
      operator_delete((undefined8 *)*local_450);
    }
  }
  else {
    puVar3 = (undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId);
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    pRVar6 = ctx.mRegistry;
    nwk._0_8_ = &nwk.mName._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nwk,"127.0.0.1","");
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_3bc,0,0,0,0,0);
    local_4a0 = (undefined1  [8])local_490;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"net1","");
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"domain1","");
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    pcVar9 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"","");
    ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&nwk,0x4e21,&local_338,(string *)&value,local_3bc,
               (string *)local_4a0,0,&local_4e8,&local_448,(Timestamp)0x0,0,&local_4c8,&local_358,
               &local_3e0,'\0',0,&local_318,local_2f0,0x101f);
    local_4e9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
    local_4ea = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_458,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_4e9,&local_4ea);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p);
    }
    if (local_4a0 != (undefined1  [8])local_490) {
      operator_delete((void *)local_4a0);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
      operator_delete((void *)nwk._0_8_);
    }
    puVar3 = local_450;
    if (local_458[0] == (internal)0x0) {
      testing::Message::Message((Message *)&br);
      if (local_450 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_450;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x5e4,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if (br._vptr_BorderRouter != (_func_int **)0x0) {
        (**(code **)(*br._vptr_BorderRouter + 8))();
      }
      if (local_450 == (undefined8 *)0x0) goto LAB_00175efc;
      if ((undefined8 *)*local_450 != local_450 + 2) {
        operator_delete((undefined8 *)*local_450);
      }
    }
    else {
      if (local_450 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_450 != local_450 + 2) {
          operator_delete((undefined8 *)*local_450);
        }
        operator_delete(puVar3);
      }
      pRVar6 = ctx.mRegistry;
      nwk._0_8_ = &nwk.mName._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&nwk,"127.0.0.2","");
      local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      value.mError._0_8_ = &value.mError.mMessage._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)&value,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_3c0,0,0,0,0,0);
      local_4a0 = (undefined1  [8])local_490;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"net2","");
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"");
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"");
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"domain1","");
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      local_320 = "";
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318);
      ot::commissioner::UnixTime::UnixTime(&local_2f8,0);
      pcVar9 = (char *)(ulong)(uint)local_3c0;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&nwk,0x4e22,&local_338,(string *)&value,local_3c0,
                 (string *)local_4a0,1,&local_4e8,&local_448,(Timestamp)0x0,0,&local_4c8,&local_358,
                 &local_3e0,'\0',0,&local_318,local_2f8,0x101f);
      local_4e9 = ot::commissioner::persistent_storage::Registry::Add(pRVar6,(BorderAgent *)&br);
      local_4ea = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_458,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_4e9,&local_4ea);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p);
      }
      if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (local_4a0 != (undefined1  [8])local_490) {
        operator_delete((void *)local_4a0);
      }
      if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
        operator_delete((void *)value.mError._0_8_);
      }
      if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if ((size_type *)nwk._0_8_ != &nwk.mName._M_string_length) {
        operator_delete((void *)nwk._0_8_);
      }
      if (local_458[0] != (internal)0x0) {
        if (local_450 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_450 != local_450 + 2) {
            operator_delete((undefined8 *)*local_450);
          }
          operator_delete(local_450);
        }
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
        ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk.mId,0);
        br.mNetworkId = nwk.mId;
        SVar7 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br)
        ;
        value.mError.mCode._0_1_ = SVar7;
        local_4a0 = (undefined1  [8])((ulong)local_4a0 & 0xffffffffffffff00);
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwk,"ctx.mRegistry->SetCurrentNetwork(br)",
                   "RegistryStatus::kSuccess",(Status *)&value,local_4a0);
        _Var5 = nwk.mName._M_dataplus;
        if ((char)nwk.mId.mId == '\0') {
          testing::Message::Message((Message *)&value);
          if (nwk.mName._M_dataplus._M_p == (pointer)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)nwk.mName._M_dataplus._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_4a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x5eb,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_4a0,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a0);
          if (value.mError._0_8_ != 0) {
            (**(code **)(*(long *)value.mError._0_8_ + 8))();
          }
          if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
            if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
              operator_delete(*nwk.mName._M_dataplus._M_p);
            }
            goto LAB_001765a7;
          }
        }
        else {
          if (nwk.mName._M_dataplus._M_p != (pointer)0x0) {
            if (*nwk.mName._M_dataplus._M_p != nwk.mName._M_dataplus._M_p + 0x10) {
              operator_delete(*nwk.mName._M_dataplus._M_p);
            }
            operator_delete(_Var5._M_p);
          }
          ot::commissioner::persistent_storage::Network::Network(&nwk);
          SVar7 = ot::commissioner::persistent_storage::Registry::GetCurrentNetwork
                            (ctx.mRegistry,&nwk);
          local_4a0[0] = (string)SVar7;
          local_4e8._M_dataplus._M_p = local_4e8._M_dataplus._M_p & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",local_4a0,(Status *)&local_4e8);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4a0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5ee,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4e8,(Message *)local_4a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
            if (local_4a0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4a0 + 8))();
            }
          }
          _Var5._M_p = value.mError.mMessage._M_dataplus._M_p;
          if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
            if (*value.mError.mMessage._M_dataplus._M_p !=
                value.mError.mMessage._M_dataplus._M_p + 0x10) {
              operator_delete(*value.mError.mMessage._M_dataplus._M_p);
            }
            operator_delete(_Var5._M_p);
          }
          local_4a0 = (undefined1  [8])((ulong)local_4a0 & 0xffffffff00000000);
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&value,"nwk.mId.mId","0",(uint *)&nwk,(int *)local_4a0);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4a0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5ef,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4e8,(Message *)local_4a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
            if (local_4a0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_4a0 + 8))();
            }
          }
          if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
            if (*value.mError.mMessage._M_dataplus._M_p !=
                value.mError.mMessage._M_dataplus._M_p + 0x10) {
              operator_delete(*value.mError.mMessage._M_dataplus._M_p);
            }
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          local_448.field_2._M_allocated_capacity = 0;
          local_448._M_dataplus._M_p = (pointer)0x0;
          local_448._M_string_length = 0;
          paVar1 = &value.mError.mMessage.field_2;
          value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          paVar2 = &value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          local_4a0 = (undefined1  [8])local_490;
          value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
          value.mData._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"Network select 3","")
          ;
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&local_4c8,&ctx.mInterpreter,(string *)local_4a0);
          local_4e8.field_2._M_allocated_capacity = local_448.field_2._M_allocated_capacity;
          local_4e8._M_string_length = local_448._M_string_length;
          local_4e8._M_dataplus._M_p = local_448._M_dataplus._M_p;
          local_448.field_2._M_allocated_capacity = local_4c8.field_2._M_allocated_capacity;
          local_448._M_dataplus._M_p = local_4c8._M_dataplus._M_p;
          local_448._M_string_length = local_4c8._M_string_length;
          local_4c8._M_dataplus._M_p = (pointer)0x0;
          local_4c8._M_string_length = 0;
          local_4c8.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4c8);
          if (local_4a0 != (undefined1  [8])local_490) {
            operator_delete((void *)local_4a0);
          }
          ot::commissioner::Interpreter::Eval
                    ((Value *)local_4a0,&ctx.mInterpreter,(Expression *)&local_448);
          value.mError.mCode = local_4a0._0_4_;
          std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_498);
          std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_478);
          if (local_478._M_p != local_468) {
            operator_delete(local_478._M_p);
          }
          if (local_498._M_p != local_488) {
            operator_delete(local_498._M_p);
          }
          bVar8 = ot::commissioner::Interpreter::Value::HasNoError(&value);
          local_4e8._M_string_length = 0;
          local_4e8._M_dataplus._M_p._0_1_ = !bVar8;
          if (bVar8) {
            testing::Message::Message((Message *)&local_4c8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_4a0,(internal *)&local_4e8,(AssertionResult *)0x2ddeee,"true"
                       ,"false",pcVar9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_3e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5f6,(char *)local_4a0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_3e0,(Message *)&local_4c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e0);
            if (local_4a0 != (undefined1  [8])local_490) {
              operator_delete((void *)local_4a0);
            }
            if ((long *)local_4c8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_4c8._M_dataplus._M_p + 8))();
            }
            sVar4 = local_4e8._M_string_length;
            if ((undefined8 *)local_4e8._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_4e8._M_string_length !=
                  (undefined8 *)(local_4e8._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_4e8._M_string_length);
              }
              operator_delete((void *)sVar4);
            }
          }
          local_4e8._M_dataplus._M_p._0_1_ =
               ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(ctx.mRegistry,&nwk)
          ;
          local_4c8._M_dataplus._M_p = local_4c8._M_dataplus._M_p & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)local_4a0,"ctx.mRegistry->GetCurrentNetwork(nwk)",
                     "RegistryStatus::kSuccess",(Status *)&local_4e8,(Status *)&local_4c8);
          if (local_4a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_4e8);
            if (local_498._M_p == (char *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_498._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5f7,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4c8,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
            if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
            }
          }
          _Var5._M_p = local_498._M_p;
          if (local_498._M_p != (char *)0x0) {
            if (*(char **)local_498._M_p != local_498._M_p + 0x10) {
              operator_delete(*(char **)local_498._M_p);
            }
            operator_delete(_Var5._M_p);
          }
          local_4e8._M_dataplus._M_p = local_4e8._M_dataplus._M_p & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)local_4a0,"nwk.mId.mId","0",(uint *)&nwk,(int *)&local_4e8);
          if (local_4a0[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_4e8);
            if (local_498._M_p == (char *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_498._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x5f8,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4c8,(Message *)&local_4e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_4e8._M_dataplus._M_p + 8))();
            }
          }
          if (local_498._M_p != (char *)0x0) {
            if (*(char **)local_498._M_p != local_498._M_p + 0x10) {
              operator_delete(*(char **)local_498._M_p);
            }
            operator_delete(local_498._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mData._M_dataplus._M_p != paVar2) {
            operator_delete(value.mData._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
            operator_delete(value.mError.mMessage._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_448);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
            operator_delete(nwk.mMlp._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
LAB_001765a7:
            operator_delete(nwk.mName._M_dataplus._M_p);
          }
        }
        br._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_00395f58;
        ot::commissioner::BorderAgent::~BorderAgent(&br.mAgent);
        goto LAB_00175efc;
      }
      testing::Message::Message((Message *)&br);
      if (local_450 != (undefined8 *)0x0) {
        local_320 = (char *)*local_450;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nwk,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x5e8,local_320);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nwk,(Message *)&br);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk);
      if (br._vptr_BorderRouter != (_func_int **)0x0) {
        (**(code **)(*br._vptr_BorderRouter + 8))();
      }
      if (local_450 == (undefined8 *)0x0) goto LAB_00175efc;
      if ((undefined8 *)*local_450 != local_450 + 2) {
        operator_delete((undefined8 *)*local_450);
      }
    }
  }
  operator_delete(local_450);
LAB_00175efc:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_NetworkSelectNonexisting)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Network nwk;
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 0);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("Network select 3");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
    EXPECT_EQ(ctx.mRegistry->GetCurrentNetwork(nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mId.mId, 0);
}